

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

RenderBatch *
rlLoadRenderBatch(RenderBatch *__return_storage_ptr__,int numBuffers,int bufferElements)

{
  size_t __size;
  int j;
  uint uVar1;
  VertexBuffer *pVVar2;
  ulong uVar3;
  float *pfVar4;
  uchar *puVar5;
  uint *puVar6;
  ulong uVar7;
  DrawCall *pDVar8;
  int j_3;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  __return_storage_ptr__->buffersCount = 0;
  __return_storage_ptr__->currentBuffer = 0;
  pVVar2 = (VertexBuffer *)malloc((long)numBuffers * 0x48);
  __return_storage_ptr__->vertexBuffer = pVVar2;
  uVar9 = bufferElements * 0xc;
  uVar10 = bufferElements * 8;
  uVar11 = bufferElements << 4;
  __size = (long)(bufferElements * 6) * 4;
  uVar13 = 0;
  uVar16 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar16 = uVar13;
  }
  uVar15 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar15 = uVar13;
  }
  uVar14 = 0;
  if (0 < (int)uVar11) {
    uVar14 = (ulong)uVar11;
  }
  uVar3 = 0;
  if (0 < numBuffers) {
    uVar3 = (ulong)(uint)numBuffers;
  }
  for (; uVar13 != uVar3; uVar13 = uVar13 + 1) {
    pVVar2[uVar13].elementsCount = bufferElements;
    pfVar4 = (float *)malloc((long)(int)uVar9 * 4);
    pVVar2[uVar13].vertices = pfVar4;
    pfVar4 = (float *)malloc((long)(int)uVar10 * 4);
    pVVar2[uVar13].texcoords = pfVar4;
    puVar5 = (uchar *)malloc((long)(int)uVar11);
    pVVar2[uVar13].colors = puVar5;
    puVar6 = (uint *)malloc(__size);
    pVVar2[uVar13].indices = puVar6;
    for (uVar7 = 0; uVar16 != uVar7; uVar7 = uVar7 + 1) {
      pVVar2[uVar13].vertices[uVar7] = 0.0;
    }
    for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
      pVVar2[uVar13].texcoords[uVar7] = 0.0;
    }
    for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
      pVVar2[uVar13].colors[uVar7] = '\0';
    }
    uVar1 = 3;
    for (lVar12 = 0; lVar12 < bufferElements * 6; lVar12 = lVar12 + 6) {
      pVVar2[uVar13].indices[lVar12] = uVar1 - 3;
      pVVar2[uVar13].indices[lVar12 + 1] = uVar1 - 2;
      pVVar2[uVar13].indices[lVar12 + 2] = uVar1 - 1;
      pVVar2[uVar13].indices[lVar12 + 3] = uVar1 - 3;
      pVVar2[uVar13].indices[lVar12 + 4] = uVar1 - 1;
      pVVar2[uVar13].indices[lVar12 + 5] = uVar1;
      uVar1 = uVar1 + 4;
    }
    pVVar2[uVar13].vCounter = 0;
    pVVar2[uVar13].tcCounter = 0;
    pVVar2[uVar13].cCounter = 0;
  }
  TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
  for (lVar12 = 0; uVar3 * 0x48 - lVar12 != 0; lVar12 = lVar12 + 0x48) {
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glGenVertexArrays)(1,(GLuint *)((long)pVVar2->vboId + lVar12 + -4));
      (*glad_glBindVertexArray)(*(GLuint *)((long)pVVar2->vboId + lVar12 + -4));
    }
    (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar2->vboId + lVar12));
    (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar2->vboId + lVar12));
    (*glad_glBufferData)
              (0x8892,(long)(int)uVar9 * 4,*(void **)((long)pVVar2->vboId + lVar12 + -0x24),0x88e8);
    (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShader.locs);
    (*glad_glVertexAttribPointer)(*RLGL.State.currentShader.locs,3,0x1406,'\0',0,(void *)0x0);
    (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar2->vboId + lVar12 + 4));
    (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar2->vboId + lVar12 + 4));
    (*glad_glBufferData)
              (0x8892,(long)(int)uVar10 * 4,*(void **)((long)pVVar2->vboId + lVar12 + -0x1c),0x88e8)
    ;
    (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[1]);
    (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[1],2,0x1406,'\0',0,(void *)0x0);
    (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar2->vboId + lVar12 + 8));
    (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)pVVar2->vboId + lVar12 + 8));
    (*glad_glBufferData)
              (0x8892,(long)(int)uVar11,*(void **)((long)pVVar2->vboId + lVar12 + -0x14),0x88e8);
    (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[5]);
    (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[5],4,0x1401,'\x01',0,(void *)0x0);
    (*glad_glGenBuffers)(1,(GLuint *)((long)pVVar2->vboId + lVar12 + 0xc));
    (*glad_glBindBuffer)(0x8893,*(GLuint *)((long)pVVar2->vboId + lVar12 + 0xc));
    (*glad_glBufferData)(0x8893,__size,*(void **)((long)pVVar2->vboId + lVar12 + -0xc),0x88e4);
  }
  TraceLog(3,"RLGL: Render batch vertex buffers loaded successfully in VRAM (GPU)");
  if (RLGL.ExtSupported.vao != false) {
    (*glad_glBindVertexArray)(0);
  }
  pDVar8 = (DrawCall *)malloc(0x1000);
  __return_storage_ptr__->draws = pDVar8;
  uVar9 = RLGL.State.defaultTextureId;
  for (lVar12 = 0; lVar12 != 0x1000; lVar12 = lVar12 + 0x10) {
    *(undefined8 *)((long)&pDVar8->mode + lVar12) = 7;
    *(undefined4 *)((long)&pDVar8->vertexAlignment + lVar12) = 0;
    *(uint *)((long)&pDVar8->textureId + lVar12) = uVar9;
  }
  __return_storage_ptr__->buffersCount = numBuffers;
  __return_storage_ptr__->drawsCounter = 1;
  __return_storage_ptr__->currentDepth = -1.0;
  return __return_storage_ptr__;
}

Assistant:

RenderBatch rlLoadRenderBatch(int numBuffers, int bufferElements)
{
    RenderBatch batch = { 0 };

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Initialize CPU (RAM) vertex buffers (position, texcoord, color data and indexes)
    //--------------------------------------------------------------------------------------------
    batch.vertexBuffer = (VertexBuffer *)RL_MALLOC(sizeof(VertexBuffer)*numBuffers);

    for (int i = 0; i < numBuffers; i++)
    {
        batch.vertexBuffer[i].elementsCount = bufferElements;

        batch.vertexBuffer[i].vertices = (float *)RL_MALLOC(bufferElements*3*4*sizeof(float));        // 3 float by vertex, 4 vertex by quad
        batch.vertexBuffer[i].texcoords = (float *)RL_MALLOC(bufferElements*2*4*sizeof(float));       // 2 float by texcoord, 4 texcoord by quad
        batch.vertexBuffer[i].colors = (unsigned char *)RL_MALLOC(bufferElements*4*4*sizeof(unsigned char));   // 4 float by color, 4 colors by quad
#if defined(GRAPHICS_API_OPENGL_33)
        batch.vertexBuffer[i].indices = (unsigned int *)RL_MALLOC(bufferElements*6*sizeof(unsigned int));      // 6 int by quad (indices)
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
        batch.vertexBuffer[i].indices = (unsigned short *)RL_MALLOC(bufferElements*6*sizeof(unsigned short));  // 6 int by quad (indices)
#endif

        for (int j = 0; j < (3*4*bufferElements); j++) batch.vertexBuffer[i].vertices[j] = 0.0f;
        for (int j = 0; j < (2*4*bufferElements); j++) batch.vertexBuffer[i].texcoords[j] = 0.0f;
        for (int j = 0; j < (4*4*bufferElements); j++) batch.vertexBuffer[i].colors[j] = 0;

        int k = 0;

        // Indices can be initialized right now
        for (int j = 0; j < (6*bufferElements); j += 6)
        {
            batch.vertexBuffer[i].indices[j] = 4*k;
            batch.vertexBuffer[i].indices[j + 1] = 4*k + 1;
            batch.vertexBuffer[i].indices[j + 2] = 4*k + 2;
            batch.vertexBuffer[i].indices[j + 3] = 4*k;
            batch.vertexBuffer[i].indices[j + 4] = 4*k + 2;
            batch.vertexBuffer[i].indices[j + 5] = 4*k + 3;

            k++;
        }

        batch.vertexBuffer[i].vCounter = 0;
        batch.vertexBuffer[i].tcCounter = 0;
        batch.vertexBuffer[i].cCounter = 0;
    }

    TRACELOG(LOG_INFO, "RLGL: Render batch vertex buffers loaded successfully in RAM (CPU)");
    //--------------------------------------------------------------------------------------------

    // Upload to GPU (VRAM) vertex data and initialize VAOs/VBOs
    //--------------------------------------------------------------------------------------------
    for (int i = 0; i < numBuffers; i++)
    {
        if (RLGL.ExtSupported.vao)
        {
            // Initialize Quads VAO
            glGenVertexArrays(1, &batch.vertexBuffer[i].vaoId);
            glBindVertexArray(batch.vertexBuffer[i].vaoId);
        }

        // Quads - Vertex buffers binding and attributes enable
        // Vertex position buffer (shader-location = 0)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[0]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[0]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*3*4*sizeof(float), batch.vertexBuffer[i].vertices, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);

        // Vertex texcoord buffer (shader-location = 1)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[1]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[1]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*2*4*sizeof(float), batch.vertexBuffer[i].texcoords, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);

        // Vertex color buffer (shader-location = 3)
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[2]);
        glBindBuffer(GL_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[2]);
        glBufferData(GL_ARRAY_BUFFER, bufferElements*4*4*sizeof(unsigned char), batch.vertexBuffer[i].colors, GL_DYNAMIC_DRAW);
        glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR]);
        glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);

        // Fill index buffer
        glGenBuffers(1, &batch.vertexBuffer[i].vboId[3]);
        glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch.vertexBuffer[i].vboId[3]);
#if defined(GRAPHICS_API_OPENGL_33)
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, bufferElements*6*sizeof(int), batch.vertexBuffer[i].indices, GL_STATIC_DRAW);
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, bufferElements*6*sizeof(short), batch.vertexBuffer[i].indices, GL_STATIC_DRAW);
#endif
    }

    TRACELOG(LOG_INFO, "RLGL: Render batch vertex buffers loaded successfully in VRAM (GPU)");

    // Unbind the current VAO
    if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    //--------------------------------------------------------------------------------------------

    // Init draw calls tracking system
    //--------------------------------------------------------------------------------------------
    batch.draws = (DrawCall *)RL_MALLOC(DEFAULT_BATCH_DRAWCALLS*sizeof(DrawCall));

    for (int i = 0; i < DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch.draws[i].mode = RL_QUADS;
        batch.draws[i].vertexCount = 0;
        batch.draws[i].vertexAlignment = 0;
        //batch.draws[i].vaoId = 0;
        //batch.draws[i].shaderId = 0;
        batch.draws[i].textureId = RLGL.State.defaultTextureId;
        //batch.draws[i].RLGL.State.projection = MatrixIdentity();
        //batch.draws[i].RLGL.State.modelview = MatrixIdentity();
    }

    batch.buffersCount = numBuffers;    // Record buffer count
    batch.drawsCounter = 1;             // Reset draws counter
    batch.currentDepth = -1.0f;         // Reset depth value
    //--------------------------------------------------------------------------------------------
#endif

    return batch;
}